

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::handleUnexpectedInflightException
          (RunContext *this,AssertionInfo *info,string *message,AssertionReaction *reaction)

{
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  size_t sVar4;
  size_type sVar5;
  AssertionResultData data;
  AssertionResult assertionResult;
  AssertionResultData local_110;
  AssertionResult local_b8;
  
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar1 = (info->macroName).m_start;
  sVar2 = (info->macroName).m_size;
  pcVar3 = (info->lineInfo).file;
  sVar4 = (info->lineInfo).line;
  sVar5 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar5;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar3;
  (this->m_lastAssertionInfo).lineInfo.line = sVar4;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar1;
  (this->m_lastAssertionInfo).macroName.m_size = sVar2;
  local_110.message._M_dataplus._M_p = (pointer)&local_110.message.field_2;
  local_110.message._M_string_length = 0;
  local_110.message.field_2._M_local_buf[0] = '\0';
  local_110.reconstructedExpression._M_dataplus._M_p =
       (pointer)&local_110.reconstructedExpression.field_2;
  local_110.reconstructedExpression._M_string_length = 0;
  local_110.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  local_110.lazyExpression.m_transientExpression = (ITransientExpression *)0x0;
  local_110.lazyExpression.m_isNegated = false;
  local_110.resultType = ThrewException;
  std::__cxx11::string::_M_assign((string *)&local_110);
  local_b8.m_info.resultDisposition = info->resultDisposition;
  local_b8.m_info._52_4_ = *(undefined4 *)&info->field_0x34;
  local_b8.m_info.macroName.m_start = (info->macroName).m_start;
  local_b8.m_info.macroName.m_size = (info->macroName).m_size;
  local_b8.m_info.lineInfo.file = (info->lineInfo).file;
  local_b8.m_info.lineInfo.line = (info->lineInfo).line;
  local_b8.m_info.capturedExpression.m_start = (info->capturedExpression).m_start;
  local_b8.m_info.capturedExpression.m_size = (info->capturedExpression).m_size;
  AssertionResultData::AssertionResultData(&local_b8.m_resultData,&local_110);
  assertionEnded(this,&local_b8);
  populateReaction(this,reaction);
  AssertionResultData::~AssertionResultData(&local_b8.m_resultData);
  AssertionResultData::~AssertionResultData(&local_110);
  return;
}

Assistant:

void RunContext::handleUnexpectedInflightException(
            AssertionInfo const& info,
            std::string const& message,
            AssertionReaction& reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( ResultWas::ThrewException, LazyExpression( false ) );
        data.message = message;
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );
        populateReaction( reaction );
    }